

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int foreach_hash_entry(hash_table_t *table,void *opaque,
                      _func_int_hash_key_t_hash_data_t_void_ptr *cb)

{
  hash_entry_t *phVar1;
  int iVar2;
  hash_entry_t **pphVar3;
  
  pphVar3 = &table->head;
  do {
    phVar1 = *pphVar3;
    if (phVar1 == (hash_entry_t *)0x0) {
      return 0;
    }
    iVar2 = (*cb)(phVar1->key,phVar1->data,opaque);
    pphVar3 = &phVar1->next;
  } while (iVar2 == 0);
  return iVar2;
}

Assistant:

int foreach_hash_entry(hash_table_t *table, void *opaque, int (*cb)(hash_key_t key, hash_data_t data, void *opaque))
{
   int result;
   struct hash_entry_t *i;
   for (i = table->head; i != NULL; i = i->next) {
      result = cb(i->key, i->data, opaque);
      if (result != 0)
         return result;
   }
   return 0;
}